

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Point2f __thiscall pbrt::SobolSampler::GetPixel2D(SobolSampler *this)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_000012c4 [12];
  Point2f u;
  Float local_40 [4];
  
  local_40[3] = SampleDimension(this,0);
  iVar4 = 1;
  local_40[1] = SampleDimension(this,1);
  local_40[0] = local_40[3];
  do {
    if (GetPixel2D()::reg == '\0') {
      iVar3 = __cxa_guard_acquire(&GetPixel2D()::reg);
      if (iVar3 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)&GetPixel2D()::reg,
                   GetPixel2D()::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                   (PixelAccumFunc)0x0);
        __cxa_guard_release(&GetPixel2D()::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x600) = *(long *)(in_FS_OFFSET + -0x600) + 1;
    bVar5 = iVar4 != 1;
    auVar6._0_4_ = (float)this->scale;
    auVar6._4_12_ = in_register_000012c4;
    auVar8._0_4_ = (float)(&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x)[bVar5];
    auVar8._4_12_ = in_register_000012c4;
    auVar6 = vfmsub231ss_fma(auVar8,auVar6,ZEXT416((uint)local_40[bVar5]));
    if (auVar6._0_4_ < 0.0) {
      *(long *)(in_FS_OFFSET + -0x608) = *(long *)(in_FS_OFFSET + -0x608) + 1;
    }
    if (GetPixel2D()::reg == '\0') {
      iVar3 = __cxa_guard_acquire(&GetPixel2D()::reg);
      if (iVar3 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)&GetPixel2D()::reg,
                   GetPixel2D()::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                   (PixelAccumFunc)0x0);
        __cxa_guard_release(&GetPixel2D()::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x5f0) = *(long *)(in_FS_OFFSET + -0x5f0) + 1;
    auVar9._0_4_ = (float)this->scale;
    auVar9._4_12_ = in_register_000012c4;
    auVar7._0_4_ = (float)(&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x)[bVar5];
    auVar7._4_12_ = in_register_000012c4;
    auVar6 = vfmsub231ss_fma(auVar7,auVar9,ZEXT416((uint)local_40[bVar5]));
    if (1.0 < auVar6._0_4_) {
      *(long *)(in_FS_OFFSET + -0x5f8) = *(long *)(in_FS_OFFSET + -0x5f8) + 1;
    }
    auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar6);
    uVar1 = vcmpss_avx512f(auVar6,ZEXT816(0) << 0x40,1);
    local_40[bVar5] = (Float)((uint)!(bool)((byte)uVar1 & 1) * auVar8._0_4_);
    iVar4 = iVar4 + -1;
  } while (iVar4 == 0);
  TVar2.y = local_40[1];
  TVar2.x = local_40[0];
  return (Point2f)TVar2;
}

Assistant:

PBRT_CPU_GPU
    Point2f GetPixel2D() {
        Point2f u(SampleDimension(0), SampleDimension(1));
        // Remap Sobol$'$ dimensions used for pixel samples
        for (int dim = 0; dim < 2; ++dim) {
            CHECK_RARE(1e-7, u[dim] * scale - pixel[dim] < 0);
            CHECK_RARE(1e-7, u[dim] * scale - pixel[dim] > 1);
            u[dim] = Clamp(u[dim] * scale - pixel[dim], 0, OneMinusEpsilon);
        }

        return u;
    }